

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tests.cpp
# Opt level: O0

vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_> * __thiscall
TestRunner::getTestsList
          (vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>
           *__return_storage_ptr__,TestRunner *this,path *dir)

{
  bool bVar1;
  directory_entry *this_00;
  path *this_01;
  reference __args;
  path *test;
  iterator __end3;
  iterator __begin3;
  vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_> *__range3;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  path local_d8;
  undefined1 local_b8 [8];
  path fileName;
  path *path;
  directory_entry *entry;
  undefined1 local_80 [8];
  directory_iterator __end1;
  undefined1 local_60 [8];
  directory_iterator __begin1;
  directory_iterator local_40;
  directory_iterator *local_30;
  directory_iterator *__range1;
  path *local_20;
  path *dir_local;
  TestRunner *this_local;
  vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_> *tests;
  
  __range1._7_1_ = 0;
  local_20 = dir;
  dir_local = (path *)this;
  this_local = (TestRunner *)__return_storage_ptr__;
  std::vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>::vector
            (__return_storage_ptr__);
  ghc::filesystem::directory_iterator::directory_iterator(&local_40,local_20);
  local_30 = &local_40;
  ghc::filesystem::directory_iterator::directory_iterator
            ((directory_iterator *)
             &__end1._impl.
              super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,local_30);
  ghc::filesystem::begin
            ((filesystem *)local_60,
             (directory_iterator *)
             &__end1._impl.
              super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  ghc::filesystem::directory_iterator::~directory_iterator
            ((directory_iterator *)
             &__end1._impl.
              super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  ghc::filesystem::end((directory_iterator *)local_80);
  while (bVar1 = ghc::filesystem::directory_iterator::operator!=
                           ((directory_iterator *)local_60,(directory_iterator *)local_80), bVar1) {
    this_00 = ghc::filesystem::directory_iterator::operator*((directory_iterator *)local_60);
    bVar1 = ghc::filesystem::directory_entry::is_directory(this_00);
    if (bVar1) {
      this_01 = ghc::filesystem::directory_entry::path(this_00);
      fileName._path.field_2._8_8_ = this_01;
      ghc::filesystem::path::filename((path *)&__range3,this_01);
      ghc::filesystem::path::u8string_abi_cxx11_(&local_118,(path *)&__range3);
      std::operator+(&local_f8,&local_118,".asm");
      ghc::filesystem::path::path(&local_d8,&local_f8,auto_format);
      ghc::filesystem::operator/((path *)local_b8,this_01,&local_d8);
      ghc::filesystem::path::~path(&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
      ghc::filesystem::path::~path((path *)&__range3);
      bVar1 = ghc::filesystem::exists((path *)local_b8);
      if (bVar1) {
        std::vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>::push_back
                  (__return_storage_ptr__,(value_type *)fileName._path.field_2._8_8_);
      }
      else {
        getTestsList((vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_> *)
                     &__begin3,this,(path *)fileName._path.field_2._8_8_);
        __end3 = std::vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>::begin
                           ((vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_> *
                            )&__begin3);
        test = (path *)std::vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>::
                       end((vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_> *)
                           &__begin3);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<ghc::filesystem::path_*,_std::vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>_>
                                           *)&test), bVar1) {
          __args = __gnu_cxx::
                   __normal_iterator<ghc::filesystem::path_*,_std::vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>_>
                   ::operator*(&__end3);
          std::vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>::
          emplace_back<ghc::filesystem::path>(__return_storage_ptr__,__args);
          __gnu_cxx::
          __normal_iterator<ghc::filesystem::path_*,_std::vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>_>
          ::operator++(&__end3);
        }
        std::vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>::~vector
                  ((vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_> *)
                   &__begin3);
      }
      ghc::filesystem::path::~path((path *)local_b8);
    }
    ghc::filesystem::directory_iterator::operator++((directory_iterator *)local_60);
  }
  ghc::filesystem::directory_iterator::~directory_iterator((directory_iterator *)local_80);
  ghc::filesystem::directory_iterator::~directory_iterator((directory_iterator *)local_60);
  ghc::filesystem::directory_iterator::~directory_iterator(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<fs::path> TestRunner::getTestsList(const fs::path& dir)
{
	std::vector<fs::path> tests;

	for(auto &entry : fs::directory_iterator(dir))
	{
		if (!entry.is_directory())
			continue;

		const auto &path = entry.path();
		fs::path fileName = path / (path.filename().u8string() + ".asm");

		if (fs::exists(fileName))
		{
			tests.push_back(path);
		}
		else
		{
			for (auto &&test : getTestsList(path))
			{
				tests.emplace_back(std::move(test));
			}
		}
	}

	return tests;
}